

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize.h
# Opt level: O0

void stbir__calculate_sample_range_upsample
               (int n,float out_filter_radius,float scale_ratio,float out_shift,int *in_first_pixel,
               int *in_last_pixel,float *in_center_of_out)

{
  float fVar1;
  double dVar2;
  float in_pixel_influence_upperbound;
  float in_pixel_influence_lowerbound;
  float out_pixel_influence_upperbound;
  float out_pixel_influence_lowerbound;
  float out_pixel_center;
  float *in_center_of_out_local;
  int *in_last_pixel_local;
  int *in_first_pixel_local;
  float out_shift_local;
  float scale_ratio_local;
  float out_filter_radius_local;
  int n_local;
  
  fVar1 = (float)n + 0.5;
  *in_center_of_out = (fVar1 + out_shift) / scale_ratio;
  dVar2 = floor((double)(((fVar1 - out_filter_radius) + out_shift) / scale_ratio) + 0.5);
  *in_first_pixel = (int)dVar2;
  dVar2 = floor((double)((fVar1 + out_filter_radius + out_shift) / scale_ratio) - 0.5);
  *in_last_pixel = (int)dVar2;
  return;
}

Assistant:

static void stbir__calculate_sample_range_upsample(int n, float out_filter_radius, float scale_ratio, float out_shift, int* in_first_pixel, int* in_last_pixel, float* in_center_of_out)
{
    float out_pixel_center = (float)n + 0.5f;
    float out_pixel_influence_lowerbound = out_pixel_center - out_filter_radius;
    float out_pixel_influence_upperbound = out_pixel_center + out_filter_radius;

    float in_pixel_influence_lowerbound = (out_pixel_influence_lowerbound + out_shift) / scale_ratio;
    float in_pixel_influence_upperbound = (out_pixel_influence_upperbound + out_shift) / scale_ratio;

    *in_center_of_out = (out_pixel_center + out_shift) / scale_ratio;
    *in_first_pixel = (int)(floor(in_pixel_influence_lowerbound + 0.5));
    *in_last_pixel = (int)(floor(in_pixel_influence_upperbound - 0.5));
}